

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothubtransportamqp_methods.c
# Opt level: O3

void remove_tracked_handle
               (IOTHUBTRANSPORT_AMQP_METHODS *amqp_methods_handle,
               IOTHUBTRANSPORT_AMQP_METHOD_HANDLE method_request_handle)

{
  IOTHUBTRANSPORT_AMQP_METHOD_HANDLE *ppIVar1;
  LOGGER_LOG p_Var2;
  ulong uVar3;
  size_t sVar4;
  
  sVar4 = amqp_methods_handle->method_request_handle_count;
  if (sVar4 != 0) {
    uVar3 = 0;
    do {
      if (amqp_methods_handle->method_request_handles[uVar3] == method_request_handle) {
        if (1 < sVar4 - uVar3) {
          ppIVar1 = amqp_methods_handle->method_request_handles + uVar3;
          memmove(ppIVar1,ppIVar1 + 1,(sVar4 - uVar3) * 8 - 8);
          sVar4 = amqp_methods_handle->method_request_handle_count;
        }
        sVar4 = sVar4 - 1;
        amqp_methods_handle->method_request_handle_count = sVar4;
        uVar3 = uVar3 - 1;
      }
      uVar3 = uVar3 + 1;
    } while (uVar3 < sVar4);
    if (sVar4 != 0) {
      if ((sVar4 >> 0x3d == 0) &&
         (ppIVar1 = (IOTHUBTRANSPORT_AMQP_METHOD_HANDLE *)
                    realloc(amqp_methods_handle->method_request_handles,sVar4 << 3),
         ppIVar1 != (IOTHUBTRANSPORT_AMQP_METHOD_HANDLE *)0x0)) {
        amqp_methods_handle->method_request_handles = ppIVar1;
        return;
      }
      p_Var2 = xlogging_get_log_function();
      if (p_Var2 == (LOGGER_LOG)0x0) {
        return;
      }
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransportamqp_methods.c"
                ,"remove_tracked_handle",0x61,1,"realloc error, size:%zu",
                -(ulong)(sVar4 >> 0x3d != 0) | sVar4 << 3);
      return;
    }
  }
  free(amqp_methods_handle->method_request_handles);
  amqp_methods_handle->method_request_handles = (IOTHUBTRANSPORT_AMQP_METHOD_HANDLE *)0x0;
  return;
}

Assistant:

static void remove_tracked_handle(IOTHUBTRANSPORT_AMQP_METHODS* amqp_methods_handle, IOTHUBTRANSPORT_AMQP_METHOD_HANDLE method_request_handle)
{
    size_t i;

    for (i = 0; i < amqp_methods_handle->method_request_handle_count; i++)
    {
        if (amqp_methods_handle->method_request_handles[i] == method_request_handle)
        {
            if (amqp_methods_handle->method_request_handle_count - i > 1)
            {
                (void)memmove(&amqp_methods_handle->method_request_handles[i], &amqp_methods_handle->method_request_handles[i + 1],
                    (amqp_methods_handle->method_request_handle_count - i - 1) * sizeof(IOTHUBTRANSPORT_AMQP_METHOD_HANDLE));
            }

            amqp_methods_handle->method_request_handle_count--;
            i--;
        }
    }

    if (amqp_methods_handle->method_request_handle_count == 0)
    {
        free(amqp_methods_handle->method_request_handles);
        amqp_methods_handle->method_request_handles = NULL;
    }
    else
    {
        IOTHUBTRANSPORT_AMQP_METHOD_HANDLE* new_handles;
        size_t realloc_size = safe_multiply_size_t(amqp_methods_handle->method_request_handle_count, sizeof(IOTHUBTRANSPORT_AMQP_METHOD_HANDLE));
        if (realloc_size != SIZE_MAX && (
            new_handles = (IOTHUBTRANSPORT_AMQP_METHOD_HANDLE*)realloc(amqp_methods_handle->method_request_handles, realloc_size)) != NULL)
        {
            amqp_methods_handle->method_request_handles = new_handles;
        }
        else
        {
            LogError("realloc error, size:%zu", realloc_size);
        }
    }
}